

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApprox.c
# Opt level: O0

DdNode * Cudd_RemapUnderApprox(DdManager *dd,DdNode *f,int numVars,int threshold,double quality)

{
  DdNode *pDVar1;
  DdNode *subset;
  double quality_local;
  int threshold_local;
  int numVars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddRemapUnderApprox(dd,f,numVars,threshold,quality);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_RemapUnderApprox(
  DdManager * dd /* manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* when to stop approximation */,
  double  quality /* minimum improvement for accepted changes */)
{
    DdNode *subset;

    do {
        dd->reordered = 0;
        subset = cuddRemapUnderApprox(dd, f, numVars, threshold, quality);
    } while (dd->reordered == 1);

    return(subset);

}